

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfArith(ConvertToHalfPass *this,Instruction *inst)

{
  pointer pOVar1;
  uint **ppuVar2;
  IRContext *this_00;
  __node_base _Var3;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  PodType PVar7;
  uint **ppuVar8;
  Operand *operand_1;
  pointer pOVar9;
  Operand *operand;
  __hashtable *__h;
  bool modified;
  bool hasStructOperand;
  __node_gen_type __node_gen;
  undefined1 local_8a [2];
  __node_base local_88;
  undefined1 local_80 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  uint *local_58;
  __buckets_ptr local_50;
  ConvertToHalfPass *local_48;
  __node_base local_40;
  code *local_38;
  
  local_8a[0] = 0;
  local_8a[1] = '\0';
  local_88._M_nxt = (_Hash_node_base *)inst;
  if (inst->opcode_ == OpCompositeExtract) {
    local_50 = (__buckets_ptr)(local_8a + 1);
    local_80._0_8_ = &local_50;
    local_38 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:179:23)>
               ::_M_invoke;
    local_40._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:179:23)>
         ::_M_manager;
    local_80._8_8_ = 0;
    local_80._24_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_invoke;
    local_80._16_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_manager;
    pOVar9 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_48 = this;
    if (pOVar9 == pOVar1) {
LAB_00547a80:
      (*(code *)local_80._16_8_)(local_80,local_80,3);
    }
    else {
      do {
        bVar4 = spvIsInIdType(pOVar9->type);
        if (bVar4) {
          ppuVar2 = (uint **)(pOVar9->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar8 = &(pOVar9->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar8 = ppuVar2;
          }
          local_58 = *ppuVar8;
          if ((PodType  [2])local_80._16_8_ == (PodType  [2])0x0) goto LAB_00547cd2;
          cVar5 = (*(code *)local_80._24_8_)(local_80,&local_58);
          if (cVar5 == '\0') break;
        }
        pOVar9 = pOVar9 + 1;
      } while (pOVar9 != pOVar1);
      if ((PodType  [2])local_80._16_8_ != (PodType  [2])0x0) goto LAB_00547a80;
    }
    if (local_40._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)local_40._M_nxt)(&local_50,&local_50,3);
    }
    if (local_8a[1] == '\0') goto LAB_00547ab3;
LAB_00547cbf:
    local_8a[0] = 0;
  }
  else {
LAB_00547ab3:
    local_48 = (ConvertToHalfPass *)0x0;
    local_50 = (__buckets_ptr)operator_new(0x18);
    *local_50 = &local_88;
    local_50[1] = (__node_base_ptr)local_8a;
    local_50[2] = (__node_base_ptr)this;
    local_38 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:189:21)>
               ::_M_invoke;
    local_40._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:189:21)>
         ::_M_manager;
    local_80._8_8_ = 0;
    local_80._24_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_invoke;
    local_80._16_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_manager;
    pOVar9 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_80._0_8_ =
         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)&local_50;
    if (pOVar9 == pOVar1) {
LAB_00547b87:
      (*(code *)local_80._16_8_)(local_80,local_80,3);
    }
    else {
      do {
        bVar4 = spvIsInIdType(pOVar9->type);
        if (bVar4) {
          ppuVar2 = (uint **)(pOVar9->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar8 = &(pOVar9->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar8 = ppuVar2;
          }
          local_58 = *ppuVar8;
          if ((PodType  [2])local_80._16_8_ == (PodType  [2])0x0) {
LAB_00547cd2:
            std::__throw_bad_function_call();
          }
          cVar5 = (*(code *)local_80._24_8_)(local_80,&local_58);
          if (cVar5 == '\0') break;
        }
        pOVar9 = pOVar9 + 1;
      } while (pOVar9 != pOVar1);
      if ((PodType  [2])local_80._16_8_ != (PodType  [2])0x0) goto LAB_00547b87;
    }
    if (local_40._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)local_40._M_nxt)(&local_50,&local_50,3);
    }
    bVar4 = IsFloat(this,(Instruction *)local_88._M_nxt,0x20);
    _Var3._M_nxt = local_88._M_nxt;
    if (bVar4) {
      uVar6 = 0;
      if (*(bool *)((long)(local_88._M_nxt + 5) + 4) == true) {
        uVar6 = Instruction::GetSingleWordOperand((Instruction *)local_88._M_nxt,0);
      }
      PVar7.data._M_elems = (array<signed_char,_4UL>)EquivFloatTypeId(this,uVar6,0x10);
      if (*(bool *)((long)(_Var3._M_nxt + 5) + 4) == false) {
        __assert_fail("has_type_id_",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
      }
      if (PVar7.data._M_elems == (_Type)0x0) {
        __assert_fail("ty_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
      }
      local_80._24_8_ = local_80 + 0x10;
      local_80._0_8_ = &PTR__SmallVector_00b02ef8;
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_80._16_4_ = PVar7.data._M_elems;
      local_80._8_8_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&((((OperandList *)(_Var3._M_nxt + 7))->
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   )._M_impl.super__Vector_impl_data._M_start)->words,
                 (SmallVector<unsigned_int,_2UL> *)local_80);
      local_80._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_60,local_60._M_head_impl);
      }
      uVar6 = 0;
      if (*(bool *)((long)(local_88._M_nxt + 5) + 5) == true) {
        uVar6 = Instruction::GetSingleWordOperand
                          ((Instruction *)local_88._M_nxt,
                           (uint)*(bool *)((long)(local_88._M_nxt + 5) + 4));
      }
      local_50 = (__buckets_ptr)CONCAT44(local_50._4_4_,uVar6);
      local_80._0_8_ = &this->converted_ids_;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (&this->converted_ids_);
      local_8a[0] = 1;
    }
    else if ((local_8a[0] & 1) == 0) goto LAB_00547cbf;
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    analysis::DefUseManager::AnalyzeInstUse
              ((this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (Instruction *)local_88._M_nxt);
  }
  return (bool)(local_8a[0] & 1);
}

Assistant:

bool ConvertToHalfPass::GenHalfArith(Instruction* inst) {
  bool modified = false;
  // If this is a OpCompositeExtract instruction and has a struct operand, we
  // should not relax this instruction. Doing so could cause a mismatch between
  // the result type and the struct member type.
  bool hasStructOperand = false;
  if (inst->opcode() == spv::Op::OpCompositeExtract) {
    inst->ForEachInId([&hasStructOperand, this](uint32_t* idp) {
      Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
      if (IsStruct(op_inst)) hasStructOperand = true;
    });
    if (hasStructOperand) {
      return false;
    }
  }
  // Convert all float32 based operands to float16 equivalent and change
  // instruction type to float16 equivalent.
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
    if (!IsFloat(op_inst, 32)) return;
    GenConvert(idp, 16, inst);
    modified = true;
  });
  if (IsFloat(inst, 32)) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    converted_ids_.insert(inst->result_id());
    modified = true;
  }
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}